

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

TArray<FName,_FName> * MakeStateNameList(char *fname)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  FName *this;
  FName secondpart;
  FName firstpart;
  FName cc;
  
  if (MakeStateNameList(char_const*)::namelist == '\0') {
    iVar1 = __cxa_guard_acquire(&MakeStateNameList(char_const*)::namelist);
    if (iVar1 != 0) {
      TArray<FName,_FName>::TArray(&MakeStateNameList::namelist,3);
      __cxa_atexit(TArray<FName,_FName>::~TArray,&MakeStateNameList::namelist,&__dso_handle);
      __cxa_guard_release(&MakeStateNameList(char_const*)::namelist);
    }
  }
  this = &firstpart;
  firstpart.Index = 0;
  secondpart.Index = 0;
  __s = copystring(fname);
  pcVar2 = strtok(__s,".");
  FName::operator=(this,pcVar2);
  if (firstpart.Index == 0x33) {
    secondpart.Index = 0x33;
  }
  else if (firstpart.Index == 0x9c) {
    secondpart.Index = 0xce;
  }
  else if (firstpart.Index == 0x9d) {
    secondpart.Index = 0xa4;
  }
  else {
    if (firstpart.Index != 0x9e) {
      TArray<FName,_FName>::Clear(&MakeStateNameList::namelist);
      goto LAB_004531ab;
    }
    secondpart.Index = 0x9e;
  }
  firstpart.Index = 0x8c;
  TArray<FName,_FName>::Clear(&MakeStateNameList::namelist);
  TArray<FName,_FName>::Push(&MakeStateNameList::namelist,&firstpart);
  this = &secondpart;
LAB_004531ab:
  TArray<FName,_FName>::Push(&MakeStateNameList::namelist,this);
  while( true ) {
    pcVar2 = strtok((char *)0x0,".");
    if (pcVar2 == (char *)0x0) break;
    FName::FName(&cc,pcVar2);
    TArray<FName,_FName>::Push(&MakeStateNameList::namelist,&cc);
  }
  if (__s != (char *)0x0) {
    operator_delete__(__s);
  }
  return &MakeStateNameList::namelist;
}

Assistant:

TArray<FName> &MakeStateNameList(const char * fname)
{
	static TArray<FName> namelist(3);
	FName firstpart, secondpart;
	char *c;

	// Handle the old names for the existing death states
	char *name = copystring(fname);
	firstpart = strtok(name, ".");
	switch (firstpart)
	{
	case NAME_Burn:
		firstpart = NAME_Death;
		secondpart = NAME_Fire;
		break;
	case NAME_Ice:
		firstpart = NAME_Death;
		secondpart = NAME_Ice;
		break;
	case NAME_Disintegrate:
		firstpart = NAME_Death;
		secondpart = NAME_Disintegrate;
		break;
	case NAME_XDeath:
		firstpart = NAME_Death;
		secondpart = NAME_Extreme;
		break;
	}

	namelist.Clear();
	namelist.Push(firstpart);
	if (secondpart != NAME_None)
	{
		namelist.Push(secondpart);
	}

	while ((c = strtok(NULL, ".")) != NULL)
	{
		FName cc = c;
		namelist.Push(cc);
	}
	delete[] name;
	return namelist;
}